

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O0

size_t get_result(char *buf,RcvMsg *rmsg)

{
  int iVar1;
  char *pcVar2;
  DurationMsg *cmsg_1;
  FailMsg *fmsg;
  LocMsg *lmsg;
  CtxMsg *cmsg;
  size_t msgsz;
  ptrdiff_t n;
  CheckMsg msg;
  RcvMsg *pRStack_18;
  ck_msg_type type;
  RcvMsg *rmsg_local;
  char *buf_local;
  
  pRStack_18 = rmsg;
  rmsg_local = (RcvMsg *)buf;
  iVar1 = upack(buf,(CheckMsg *)&n,(ck_msg_type *)((long)&msg.loc_msg.file + 4));
  if (-1 < (long)iVar1) {
    if (msg._12_4_ == 0) {
      rcvmsg_update_ctx(pRStack_18,(ck_result_ctx)n);
    }
    else if (msg._12_4_ == 2) {
      if (pRStack_18->failctx == CK_CTX_INVALID) {
        rcvmsg_update_loc(pRStack_18,(char *)msg.fail_msg.msg,(ck_result_ctx)n);
      }
      free((void *)msg.fail_msg.msg);
    }
    else if (msg._12_4_ == 1) {
      if (pRStack_18->msg == (char *)0x0) {
        pcVar2 = strdup((char *)CONCAT44(n._4_4_,(ck_result_ctx)n));
        pRStack_18->msg = pcVar2;
        pRStack_18->failctx = pRStack_18->lastctx;
      }
      free((void *)CONCAT44(n._4_4_,(ck_result_ctx)n));
    }
    else if (msg._12_4_ == 3) {
      pRStack_18->duration = (ck_result_ctx)n;
    }
    else {
      check_type(msg._12_4_,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
                 ,0x1c0);
    }
    return (long)iVar1;
  }
  eprintf("Error in call to upack",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
          ,0x195);
}

Assistant:

static size_t get_result(char *buf, RcvMsg * rmsg)
{
    enum ck_msg_type type;
    CheckMsg msg;
    ptrdiff_t n;
    size_t msgsz;

    n = upack(buf, &msg, &type);
    if(n < 0)
        eprintf("Error in call to upack", __FILE__, __LINE__ - 2);
    msgsz = (size_t) n;

    if(type == CK_MSG_CTX)
    {
        CtxMsg *cmsg = (CtxMsg *) & msg;

        rcvmsg_update_ctx(rmsg, cmsg->ctx);
    }
    else if(type == CK_MSG_LOC)
    {
        LocMsg *lmsg = (LocMsg *) & msg;

        if(rmsg->failctx == CK_CTX_INVALID)
        {
            rcvmsg_update_loc(rmsg, lmsg->file, lmsg->line);
        }
        free(lmsg->file);
    }
    else if(type == CK_MSG_FAIL)
    {
        FailMsg *fmsg = (FailMsg *) & msg;

        if(rmsg->msg == NULL)
        {
            rmsg->msg = strdup(fmsg->msg);
            rmsg->failctx = rmsg->lastctx;
        }
        else
        {
            /* Skip subsequent failure messages, only happens for CK_NOFORK */
        }
        free(fmsg->msg);
    }
    else if(type == CK_MSG_DURATION)
    {
        DurationMsg *cmsg = (DurationMsg *) & msg;

        rmsg->duration = cmsg->duration;
    }
    else
        check_type(type, __FILE__, __LINE__);

    return msgsz;
}